

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O2

bool __thiscall Js::DynamicType::SetHasNoEnumerableProperties(DynamicType *this,bool value)

{
  DynamicTypeHandler *pDVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  undefined7 in_register_00000031;
  undefined8 local_88;
  PropertyValueInfo info;
  undefined8 uStack_40;
  PropertyId propertyId;
  JavascriptString *propertyString;
  PropertyIndex propertyIndex;
  
  if ((int)CONCAT71(in_register_00000031,value) == 0) {
    this->hasNoEnumerableProperties = false;
  }
  else {
    propertyString._6_2_ = 0xffff;
    uStack_40 = 0;
    info.isFunctionPIC = true;
    info.allowResizingPolymorphicInlineCache = true;
    info._62_2_ = 0xffff;
    local_88 = 0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    pDVar1 = (this->typeHandler).ptr;
    pSVar5 = Js::Type::GetScriptContext(&this->super_Type);
    iVar4 = (*pDVar1->_vptr_DynamicTypeHandler[10])
                      (pDVar1,pSVar5,(long)&propertyString + 6,&stack0xffffffffffffffc0,
                       &info.isFunctionPIC,0,this,this,0,0,&local_88);
    if (iVar4 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0xb6,
                                  "(!this->GetTypeHandler()->FindNextProperty(this->GetScriptContext(), propertyIndex, &propertyString, &propertyId, nullptr, this, this, EnumeratorFlags::None, nullptr, &info))"
                                  ,
                                  "!this->GetTypeHandler()->FindNextProperty(this->GetScriptContext(), propertyIndex, &propertyString, &propertyId, nullptr, this, this, EnumeratorFlags::None, nullptr, &info)"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    this->hasNoEnumerableProperties = true;
  }
  return value;
}

Assistant:

bool
    DynamicType::SetHasNoEnumerableProperties(bool value)
    {
        if (!value)
        {
            this->hasNoEnumerableProperties = value;
            return false;
        }

#if DEBUG
        PropertyIndex propertyIndex = (PropertyIndex)-1;
        JavascriptString* propertyString = nullptr;
        PropertyId propertyId = Constants::NoProperty;
        PropertyValueInfo info;
        Assert(!this->GetTypeHandler()->FindNextProperty(this->GetScriptContext(), propertyIndex, &propertyString, &propertyId, nullptr, this, this, EnumeratorFlags::None, nullptr, &info));
#endif

        this->hasNoEnumerableProperties = true;
        return true;
    }